

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::StrPrefix(char *str,char *prefix)

{
  bool bVar1;
  long local_20;
  size_t i;
  char *prefix_local;
  char *str_local;
  
  local_20 = 0;
  while( true ) {
    bVar1 = false;
    if ((str[local_20] != '\0') && (bVar1 = false, prefix[local_20] != '\0')) {
      bVar1 = str[local_20] == prefix[local_20];
    }
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return prefix[local_20] == '\0';
}

Assistant:

static bool StrPrefix(const char *str, const char *prefix) {
  size_t i = 0;
  while (str[i] != '\0' && prefix[i] != '\0' && str[i] == prefix[i]) {
    ++i;
  }
  return prefix[i] == '\0';  // Consumed everything in "prefix".
}